

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_weighted_pred.c
# Opt level: O2

void ihevc_weighted_pred_chroma_uni
               (WORD16 *pi2_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD32 wgt0_cb,
               WORD32 wgt0_cr,WORD32 off0_cb,WORD32 off0_cr,WORD32 shift,WORD32 lvl_shift,WORD32 ht,
               WORD32 wd)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  
  bVar1 = (byte)shift;
  iVar5 = 1 << (bVar1 - 1 & 0x1f);
  iVar4 = 0;
  if (ht < 1) {
    ht = iVar4;
  }
  for (; iVar4 != ht; iVar4 = iVar4 + 1) {
    for (lVar3 = 0; lVar3 < wd * 2; lVar3 = lVar3 + 2) {
      iVar2 = ((pi2_src[lVar3] + lvl_shift) * wgt0_cb + iVar5 >> (bVar1 & 0x1f)) + off0_cb;
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      if (0xfe < iVar2) {
        iVar2 = 0xff;
      }
      pu1_dst[lVar3] = (UWORD8)iVar2;
      iVar2 = ((pi2_src[lVar3 + 1] + lvl_shift) * wgt0_cr + iVar5 >> (bVar1 & 0x1f)) + off0_cr;
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      if (0xfe < iVar2) {
        iVar2 = 0xff;
      }
      pu1_dst[lVar3 + 1] = (UWORD8)iVar2;
    }
    pu1_dst = pu1_dst + dst_strd;
    pi2_src = pi2_src + src_strd;
  }
  return;
}

Assistant:

void ihevc_weighted_pred_chroma_uni(WORD16 *pi2_src,
                                    UWORD8 *pu1_dst,
                                    WORD32 src_strd,
                                    WORD32 dst_strd,
                                    WORD32 wgt0_cb,
                                    WORD32 wgt0_cr,
                                    WORD32 off0_cb,
                                    WORD32 off0_cr,
                                    WORD32 shift,
                                    WORD32 lvl_shift,
                                    WORD32 ht,
                                    WORD32 wd)
{
    WORD32 row, col;
    WORD32 i4_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col += 2)
        {
            i4_tmp = (pi2_src[col] + lvl_shift) * wgt0_cb;
            i4_tmp += 1 << (shift - 1);
            i4_tmp = (i4_tmp >> shift) + off0_cb;

            pu1_dst[col] = CLIP_U8(i4_tmp);

            i4_tmp = (pi2_src[col + 1] + lvl_shift) * wgt0_cr;
            i4_tmp += 1 << (shift - 1);
            i4_tmp = (i4_tmp >> shift) + off0_cr;

            pu1_dst[col + 1] = CLIP_U8(i4_tmp);
        }

        pi2_src += src_strd;
        pu1_dst += dst_strd;
    }
}